

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

bool cb_eval(ggml_tensor *t,bool ask,void *user_data)

{
  char *__s2;
  int iVar1;
  size_t __n;
  long in_RDX;
  byte in_SIL;
  long in_RDI;
  ggml_tensor *in_stack_00000018;
  bool is_l_out;
  callback_data *cb_data;
  undefined1 local_1;
  
  __s2 = cb_eval::l_out_name;
  __n = strlen(cb_eval::l_out_name);
  iVar1 = strncmp((char *)(in_RDI + 0x100),__s2,__n);
  local_1 = iVar1 == 0;
  if ((in_SIL & 1) == 0) {
    if ((local_1) && (*(long *)(in_RDI + 0x18) == (long)*(int *)(in_RDX + 0xc))) {
      callback_data::save_tensor_for_layer(cb_data,in_stack_00000018);
      local_1 = true;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static bool cb_eval(struct ggml_tensor * t, bool ask, void * user_data) {
    auto * cb_data = (callback_data *) user_data;
    static const char * l_out_name = "l_out";
    const bool is_l_out = strncmp(t->name, l_out_name, strlen(l_out_name)) == 0;

    if (ask) {
        return is_l_out;
    }

    if (!is_l_out || t->ne[1] != cb_data->n_tokens) {
        return true;
    }

    // save the tensor to current context
    cb_data->save_tensor_for_layer(t);
    return true;
}